

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ce.cpp
# Opt level: O2

void msd_CE1(uchar **strings,size_t n,size_t depth)

{
  byte bVar1;
  uchar *puVar2;
  size_t sVar3;
  size_t i_1;
  void *__ptr;
  void *__src;
  long lVar4;
  size_t i;
  size_t sVar5;
  size_t bucketsize [256];
  size_t bucketindex [256];
  
  if (n < 0x20) {
    insertion_sort(strings,(int)n,depth);
    return;
  }
  memset(bucketsize,0,0x800);
  __ptr = malloc(n);
  for (sVar5 = 0; n != sVar5; sVar5 = sVar5 + 1) {
    bVar1 = strings[sVar5][depth];
    *(byte *)((long)__ptr + sVar5) = bVar1;
    bucketsize[bVar1] = bucketsize[bVar1] + 1;
  }
  __src = malloc(n * 8);
  bucketindex[0] = 0;
  sVar5 = 0;
  for (lVar4 = 1; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    sVar5 = sVar5 + bucketsize[lVar4 + -1];
    bucketindex[lVar4] = sVar5;
  }
  for (sVar5 = 0; n != sVar5; sVar5 = sVar5 + 1) {
    puVar2 = strings[sVar5];
    sVar3 = bucketindex[*(byte *)((long)__ptr + sVar5)];
    bucketindex[*(byte *)((long)__ptr + sVar5)] = sVar3 + 1;
    *(uchar **)((long)__src + sVar3 * 8) = puVar2;
  }
  memcpy(strings,__src,n * 8);
  free(__src);
  free(__ptr);
  for (lVar4 = 1; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    sVar5 = bucketsize[lVar4];
    if (sVar5 != 0) {
      msd_CE1(strings + bucketsize[0],sVar5,depth + 1);
      bucketsize[0] = bucketsize[0] + sVar5;
    }
  }
  return;
}

Assistant:

void
msd_CE1(unsigned char** strings, size_t n, size_t depth)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	size_t bucketsize[256] = {0};
	unsigned char* restrict oracle =
		(unsigned char*) malloc(n);
	for (size_t i=0; i < n; ++i)
		++bucketsize[oracle[i] = strings[i][depth]];
	unsigned char** restrict sorted = (unsigned char**)
		malloc(n*sizeof(unsigned char*));
	size_t bucketindex[256];
	bucketindex[0] = 0;
	for (size_t i=1; i < 256; ++i)
		bucketindex[i] = bucketindex[i-1]+bucketsize[i-1];
	for (size_t i=0; i < n; ++i)
		sorted[bucketindex[oracle[i]]++] = strings[i];
	memcpy(strings, sorted, n*sizeof(unsigned char*));
	free(sorted);
	free(oracle);
	size_t bsum = bucketsize[0];
	for (unsigned short i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_CE1(strings+bsum, bucketsize[i], depth+1);
		bsum += bucketsize[i];
	}
}